

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address_source.cpp
# Opt level: O2

string * __thiscall
address_source::address_abi_cxx11_(string *__return_storage_ptr__,address_source *this)

{
  ostream *poVar1;
  stringstream ss;
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = (ostream *)std::ostream::operator<<(local_188,this->cur_[0]);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->cur_[1]);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->cur_[2]);
  poVar1 = std::operator<<(poVar1,'.');
  std::ostream::operator<<(poVar1,this->cur_[3]);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string
address_source::address() const
{
    std::stringstream ss{};
    ss << cur_[0] << '.' << cur_[1] << '.' << cur_[2] << '.' << cur_[3];
    return ss.str();
}